

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O2

void __thiscall libtorrent::aux::merkle_tree::optimize_storage_piece_layer(merkle_tree *this)

{
  libtorrent *this_00;
  pointer pdVar1;
  digest32<256L> *pdVar2;
  bool bVar3;
  int iVar4;
  difference_type extraout_RDX;
  long lVar5;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  __first;
  digest32<256L> *pdVar6;
  long lVar7;
  digest32<256L> *this_01;
  span<const_libtorrent::digest32<256L>_> tree;
  allocator_type local_51;
  vector<sha256_hash> *local_50;
  vector<sha256_hash> new_tree;
  
  if (this->m_mode != full_tree) {
    return;
  }
  iVar4 = merkle_num_leafs(this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1 >>
                           (this->m_blocks_per_piece_log & 0x1f));
  if (this->m_blocks_per_piece_log == '\0') {
    return;
  }
  this_00 = (libtorrent *)
            (this->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = merkle_num_nodes(iVar4);
  tree.m_ptr = (digest32<256L> *)(long)iVar4;
  tree.m_len = extraout_RDX;
  bVar3 = merkle_validate_single_layer(this_00,tree);
  if (!bVar3) {
    return;
  }
  local_50 = &this->m_tree;
  pdVar1 = (this->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = block_layer_start(this);
  this_01 = pdVar1 + iVar4;
  pdVar2 = (this->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pdVar2 - (long)this_01;
  for (lVar5 = lVar7 >> 7; pdVar6 = this_01, 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar3 = digest32<256L>::is_all_zeros(this_01);
    if (!bVar3) goto LAB_0020b41e;
    bVar3 = digest32<256L>::is_all_zeros(this_01 + 1);
    pdVar6 = this_01 + 1;
    if (!bVar3) goto LAB_0020b41e;
    bVar3 = digest32<256L>::is_all_zeros(this_01 + 2);
    pdVar6 = this_01 + 2;
    if (!bVar3) goto LAB_0020b41e;
    bVar3 = digest32<256L>::is_all_zeros(this_01 + 3);
    pdVar6 = this_01 + 3;
    if (!bVar3) goto LAB_0020b41e;
    this_01 = this_01 + 4;
    lVar7 = lVar7 + -0x80;
  }
  lVar7 = lVar7 >> 5;
  if (lVar7 == 1) {
LAB_0020b49b:
    bVar3 = digest32<256L>::is_all_zeros(this_01);
    pdVar6 = this_01;
    if (bVar3) {
      pdVar6 = pdVar2;
    }
  }
  else if (lVar7 == 2) {
LAB_0020b3f8:
    bVar3 = digest32<256L>::is_all_zeros(this_01);
    pdVar6 = this_01;
    if (bVar3) {
      this_01 = this_01 + 1;
      goto LAB_0020b49b;
    }
  }
  else {
    if (lVar7 != 3) goto LAB_0020b423;
    bVar3 = digest32<256L>::is_all_zeros(this_01);
    if (bVar3) {
      this_01 = this_01 + 1;
      goto LAB_0020b3f8;
    }
  }
LAB_0020b41e:
  if (pdVar6 != pdVar2) {
    return;
  }
LAB_0020b423:
  iVar4 = piece_layer_start(this);
  __first._M_current =
       (this->m_tree).
       super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
       _M_impl.super__Vector_impl_data._M_start + iVar4;
  ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
  vector<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,void>
            ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
             &new_tree,__first,
             __first._M_current +
             (this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1 >>
             (this->m_blocks_per_piece_log & 0x1f)),&local_51);
  ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
  _M_move_assign(&local_50->
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ,(vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
                  &new_tree);
  this->m_mode = piece_layer;
  bitfield::clear(&this->m_block_verified);
  ::std::_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
  ~_Vector_base((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 *)&new_tree);
  return;
}

Assistant:

void merkle_tree::optimize_storage_piece_layer()
	{
		INVARIANT_CHECK;
		if (m_mode != mode_t::full_tree) return;

		// if we have *any* blocks, we can't transition into piece layer mode,
		// since we would lose those hashes
		int const piece_layer_size = merkle_num_leafs(num_pieces());
		if (m_blocks_per_piece_log > 0
			&& merkle_validate_single_layer(span<sha256_hash const>(m_tree).subspan(0, merkle_num_nodes(piece_layer_size)))
			&& std::all_of(m_tree.begin() + block_layer_start(), m_tree.end(), [](sha256_hash const& h) { return h.is_all_zeros(); })
			)
		{
			int const start = piece_layer_start();
			aux::vector<sha256_hash> new_tree(m_tree.begin() + start, m_tree.begin() + start + num_pieces());

			m_tree = std::move(new_tree);
			m_mode = mode_t::piece_layer;
			m_block_verified.clear();
			return;
		}
	}